

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void __thiscall
IRBuilderAsmJs::BuildSimd_1Int1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot,IRType simdType)

{
  ValueType VVar1;
  OpCode opcode;
  RegOpnd *this_00;
  RegOpnd *this_01;
  Instr *instr;
  IRBuilderAsmJs *this_02;
  
  this_00 = BuildSrcOpnd(this,src1RegSlot,TyInt32);
  VVar1 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_00->super_Opnd,VVar1);
  this_02 = this;
  this_01 = BuildDstOpnd(this,dstRegSlot,simdType);
  VVar1 = GetSimdValueTypeFromIRType(this_02,simdType);
  IR::Opnd::SetValueType(&this_01->super_Opnd,VVar1);
  opcode = GetSimdOpcode(this,newOpcode);
  instr = IR::Instr::New(opcode,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
  AddInstr(this,instr,offset);
  return;
}

Assistant:

void IRBuilderAsmJs::BuildSimd_1Int1(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot src1RegSlot, IRType simdType)
{
    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, TyInt32);
    src1Opnd->SetValueType(ValueType::GetInt(false));
    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, simdType);
    dstOpnd->SetValueType(GetSimdValueTypeFromIRType(simdType));
    Js::OpCode opcode = GetSimdOpcode(newOpcode);
    IR::Instr * instr = IR::Instr::New(opcode, dstOpnd, src1Opnd, m_func);
    AddInstr(instr, offset);
}